

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load.hpp
# Opt level: O2

int util::load<int,util::little_endian>(istream *is,size_t bits)

{
  char cVar1;
  unsigned_short uVar2;
  int iVar3;
  uint uVar4;
  
  if (bits != 0x20) {
    if (bits == 0x10) {
      uVar2 = load<short,util::little_endian>(is);
      iVar3 = (int)(short)uVar2;
    }
    else {
      if (bits != 8) goto LAB_001336b9;
      cVar1 = load<unsigned_char,util::little_endian>(is);
      iVar3 = (int)cVar1;
    }
    return iVar3;
  }
LAB_001336b9:
  uVar4 = load<int,util::little_endian>(is);
  return uVar4;
}

Assistant:

T load(std::istream & is, size_t bits) {
	if(bits == 8) {
		return load<typename compatible_integer<T, 8>::type, Endianness>(is);
	} else if(bits == 16) {
		return load<typename compatible_integer<T, 16>::type, Endianness>(is);
	} else if(bits == 32) {
		return load<typename compatible_integer<T, 32>::type, Endianness>(is);
	} else {
		return load<typename compatible_integer<T, 64>::type, Endianness>(is);
	}
}